

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlChar * xmlSchemaWildcardPCToString(int pc)

{
  char *pcStack_10;
  int pc_local;
  
  if (pc == 1) {
    pcStack_10 = "skip";
  }
  else if (pc == 2) {
    pcStack_10 = "lax";
  }
  else if (pc == 3) {
    pcStack_10 = "strict";
  }
  else {
    pcStack_10 = "invalid process contents";
  }
  return (xmlChar *)pcStack_10;
}

Assistant:

static const xmlChar *
xmlSchemaWildcardPCToString(int pc)
{
    switch (pc) {
	case XML_SCHEMAS_ANY_SKIP:
	    return (BAD_CAST "skip");
	case XML_SCHEMAS_ANY_LAX:
	    return (BAD_CAST "lax");
	case XML_SCHEMAS_ANY_STRICT:
	    return (BAD_CAST "strict");
	default:
	    return (BAD_CAST "invalid process contents");
    }
}